

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

bool __thiscall
acto::core::runtime_t::send_on_behalf
          (runtime_t *this,object_t *target,object_t *sender,
          unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *msg)

{
  bool bVar1;
  pointer pmVar2;
  worker_t *thread;
  int local_3c;
  lock_guard<std::mutex> local_38;
  lock_guard<std::mutex> g;
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *msg_local;
  object_t *sender_local;
  object_t *target_local;
  runtime_t *this_local;
  
  g._M_device = (mutex_type *)msg;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)msg);
  if (!bVar1) {
    __assert_fail("msg",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/artpaul[P]acto/src/runtime.cpp"
                  ,0xf7,
                  "bool acto::core::runtime_t::send_on_behalf(object_t *const, object_t *const, std::unique_ptr<msg_t>)"
                 );
  }
  if (target == (object_t *)0x0) {
    __assert_fail("target",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/artpaul[P]acto/src/runtime.cpp"
                  ,0xf8,
                  "bool acto::core::runtime_t::send_on_behalf(object_t *const, object_t *const, std::unique_ptr<msg_t>)"
                 );
  }
  std::lock_guard<std::mutex>::lock_guard(&local_38,&target->cs);
  if (((byte)target->field_0x60 >> 2 & 1) == 0) {
    if (sender != (object_t *)0x0) {
      pmVar2 = std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::
               operator->(msg);
      pmVar2->sender = sender;
      acquire(this,sender);
    }
    std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::unique_ptr
              ((unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *)&thread,msg
              );
    object_t::enqueue(target,(unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>
                              *)&thread);
    std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::~unique_ptr
              ((unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *)&thread);
    if ((target->field_0x60 & 1) == 0) {
      if (target->thread == (worker_t *)0x0) {
        if (((byte)target->field_0x60 >> 3 & 1) == 0) {
          target->field_0x60 = target->field_0x60 & 0xf7 | 8;
          local_3c = 0;
        }
        else {
          this_local._7_1_ = 1;
          local_3c = 1;
        }
      }
      else {
        worker_t::wakeup(target->thread);
        this_local._7_1_ = 1;
        local_3c = 1;
      }
    }
    else {
      target->field_0x60 = target->field_0x60 & 0xf7 | 8;
      this_local._7_1_ = 1;
      local_3c = 1;
    }
  }
  else {
    this_local._7_1_ = 0;
    local_3c = 1;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_38);
  if (local_3c == 0) {
    (*(this->super_callbacks)._vptr_callbacks[5])(this,target);
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool runtime_t::send_on_behalf(object_t* const target,
                               object_t* const sender,
                               std::unique_ptr<msg_t> msg) {
  assert(msg);
  assert(target);

  {
    std::lock_guard<std::mutex> g(target->cs);
    // Cannot send messages to deleting object.
    if (target->deleting) {
      return false;
    }
    // Acquire reference to a sender.
    if (sender) {
      msg->sender = sender;
      acquire(sender);
    }
    // Enqueue the message.
    target->enqueue(std::move(msg));
    // Do not try to select a worker thread for a binded actor.
    if (target->binded) {
      target->scheduled = true;
      return true;
    }
    // Wakeup object's thread if the target has
    // a dedicated thread for message processing.
    if (worker_t* const thread = target->thread) {
      thread->wakeup();
      return true;
    }
    if (target->scheduled) {
      return true;
    } else {
      target->scheduled = true;
    }
  }

  push_object(target);

  return true;
}